

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

void __thiscall re2::Regexp::ParseState::DoAlternation(ParseState *this)

{
  Regexp *this_00;
  
  DoVerticalBar(this);
  this_00 = this->stacktop_;
  this->stacktop_ = this_00->down_;
  Decref(this_00);
  DoCollapse(this,kRegexpAlternate);
  return;
}

Assistant:

void Regexp::ParseState::DoAlternation() {
  DoVerticalBar();
  // Now stack top is kVerticalBar.
  Regexp* r1 = stacktop_;
  stacktop_ = r1->down_;
  r1->Decref();
  DoCollapse(kRegexpAlternate);
}